

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O2

void __thiscall PointPseudoLog::test_method(PointPseudoLog *this)

{
  bool bVar1;
  Matrix<double,__1,_1,_0,__1,_1> local_3b8;
  undefined8 *local_3a8;
  char **local_3a0;
  int local_390 [2];
  undefined8 local_388;
  shared_count sStack_380;
  RealScalar local_378;
  Vector3d res;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_310;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  RealSpace R3;
  Point y;
  void *local_250;
  Point x;
  
  mnf::RealSpace::RealSpace(&R3,3);
  local_348 = 0x3ff0000000000000;
  uStack_340 = 0x4000000000000000;
  local_338 = 0x4008000000000000;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,3,1,0,3,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&y,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_348,(type *)0x0);
  mnf::Manifold::createPoint((Ref *)&x);
  free(local_250);
  local_390[0] = 2;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&res,local_390,(StorageBaseType *)&local_348);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_3b8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&res,(type *)0x0);
  mnf::Manifold::createPoint((Ref *)&y);
  free(local_3a0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&res);
  mnf::Point::pseudoLog((Point *)&local_3b8);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&res,&local_3b8);
  free(local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x70);
  local_378 = 1e-12;
  local_310.m_xpr = (XprTypeNested)&local_348;
  bVar1 = Eigen::internal::
          isApprox_selector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_false>
          ::run(&res,&local_310,&local_378);
  local_390[0] = CONCAT31(local_390[0]._1_3_,bVar1);
  local_388 = 0;
  sStack_380.pi_ = (sp_counted_base *)0x0;
  local_3a0 = &local_320;
  local_320 = "res.isApprox(-v)";
  local_318 = "";
  local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_1_ =
       0;
  local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)&PTR__lazy_ostream_0013ec40;
  local_3a8 = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_328 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_380);
  mnf::Point::~Point(&y);
  mnf::Point::~Point(&x);
  mnf::RealSpace::~RealSpace(&R3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointPseudoLog)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);
  Point x = R3.createPoint(v);
  Point y = R3.createPoint(2 * v);
  Eigen::Vector3d res;
  res.setZero();
  res = y.pseudoLog(x);
  BOOST_CHECK(res.isApprox(-v));
}